

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::ForEachStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger pos;
  SQUnsignedInteger SVar2;
  ulong uVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  longlong *plVar6;
  ulong uVar7;
  long lVar8;
  SQFuncState *pSVar9;
  undefined1 uVar10;
  SQUnsignedInteger SVar11;
  SQFuncState *pSVar12;
  long lVar13;
  SQObject SVar14;
  SQScope __oldscope__;
  SQObject local_88;
  SQObject local_78;
  SQObject local_68;
  SQUnsignedInteger local_58;
  SQUnsignedInteger local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar4 = SQLexer::Lex(&this->_lex);
  this->_token = SVar4;
  Expect(this,0x28);
  SVar14 = Expect(this,0x102);
  local_78._unVal = SVar14._unVal;
  local_78._type = SVar14._type;
  if (this->_token == 0x2c) {
    local_68._4_4_ = local_78._4_4_;
    local_68._type = local_78._type;
    local_68._unVal.nInteger = local_78._unVal.nInteger;
    SVar4 = SQLexer::Lex(&this->_lex);
    this->_token = SVar4;
    SVar14 = Expect(this,0x102);
    local_78._unVal = SVar14._unVal;
    local_78._type = SVar14._type;
  }
  else {
    SVar14 = SQFuncState::CreateString(this->_fs,"@INDEX@",-1);
    local_68._unVal = SVar14._unVal;
    local_68._type = SVar14._type;
  }
  Expect(this,0x118);
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar9 = this->_fs;
  (this->_scope).outers = pSVar9->_outers;
  SVar4 = SQFuncState::GetStackSize(pSVar9);
  (this->_scope).stacksize = SVar4;
  Expression(this);
  Expect(this,0x29);
  SVar4 = SQFuncState::TopTarget(this->_fs);
  SVar5 = SQFuncState::PushLocalVariable(this->_fs,&local_68);
  uVar10 = (undefined1)SVar5;
  local_88._5_1_ = uVar10;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  SVar5 = SQFuncState::PushLocalVariable(this->_fs,&local_78);
  local_88._5_1_ = (char)SVar5;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pSVar9 = this->_fs;
  SVar14 = SQFuncState::CreateString(pSVar9,"@ITERATOR@",-1);
  local_88._unVal = SVar14._unVal;
  local_88._type = SVar14._type;
  SVar5 = SQFuncState::PushLocalVariable(pSVar9,&local_88);
  local_88._5_1_ = (char)SVar5;
  local_88._4_1_ = 0x18;
  local_88._type = 1;
  local_88._6_2_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  local_58 = (this->_fs->_instructions)._size;
  local_88._5_1_ = (char)SVar4;
  local_88._4_1_ = 0x33;
  local_88._type = 0;
  local_88._6_1_ = uVar10;
  local_88._7_1_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pos = (this->_fs->_instructions)._size;
  local_88._4_1_ = 0x34;
  local_88._type = 0;
  local_88._7_1_ = 0;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  pSVar9 = this->_fs;
  local_50 = (pSVar9->_unresolvedbreaks)._size;
  SVar2 = (pSVar9->_unresolvedcontinues)._size;
  uVar3 = (pSVar9->_breaktargets)._allocated;
  uVar7 = (pSVar9->_breaktargets)._size;
  plVar6 = (pSVar9->_breaktargets)._vals;
  pSVar12 = pSVar9;
  if (uVar3 <= uVar7) {
    SVar11 = 4;
    if (uVar7 * 2 != 0) {
      SVar11 = uVar7 * 2;
    }
    plVar6 = (longlong *)sq_vm_realloc(plVar6,uVar3 << 3,SVar11 * 8);
    (pSVar9->_breaktargets)._vals = plVar6;
    (pSVar9->_breaktargets)._allocated = SVar11;
    uVar7 = (pSVar9->_breaktargets)._size;
    pSVar12 = this->_fs;
  }
  (pSVar9->_breaktargets)._size = uVar7 + 1;
  plVar6[uVar7] = 0;
  uVar3 = (pSVar12->_continuetargets)._allocated;
  plVar6 = (pSVar12->_continuetargets)._vals;
  uVar7 = (pSVar12->_continuetargets)._size;
  if (uVar3 <= uVar7) {
    SVar11 = 4;
    if (uVar7 * 2 != 0) {
      SVar11 = uVar7 * 2;
    }
    plVar6 = (longlong *)sq_vm_realloc(plVar6,uVar3 << 3,SVar11 * 8);
    (pSVar12->_continuetargets)._vals = plVar6;
    (pSVar12->_continuetargets)._allocated = SVar11;
    uVar7 = (pSVar12->_continuetargets)._size;
  }
  (pSVar12->_continuetargets)._size = uVar7 + 1;
  plVar6[uVar7] = 0;
  Statement(this,true);
  local_88._type = (int)local_58 + ~(uint)(this->_fs->_instructions)._size;
  local_88._4_4_ = 0x1c;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
  SQFuncState::SetInstructionParam(this->_fs,pos - 1,1,(this->_fs->_instructions)._size - pos);
  SQFuncState::SetInstructionParam(this->_fs,pos,1,(this->_fs->_instructions)._size - pos);
  pSVar9 = this->_fs;
  lVar13 = (pSVar9->_unresolvedbreaks)._size - local_50;
  lVar8 = (pSVar9->_unresolvedcontinues)._size - SVar2;
  if (0 < lVar8) {
    ResolveContinues(this,pSVar9,lVar8,pos - 2);
    pSVar9 = this->_fs;
  }
  if (0 < lVar13) {
    ResolveBreaks(this,pSVar9,lVar13);
    pSVar9 = this->_fs;
  }
  pSVar1 = &(pSVar9->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar9->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  SQFuncState::PopTarget(pSVar9);
  lVar8 = this->_fs->_outers;
  SVar4 = SQFuncState::GetStackSize(this->_fs);
  lVar13 = (this->_scope).stacksize;
  if (SVar4 != lVar13) {
    SQFuncState::SetStackSize(this->_fs,lVar13);
    if (lVar8 != this->_fs->_outers) {
      local_88._type = (SQObjectType)(this->_scope).stacksize;
      local_88._4_4_ = 0x3c;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_88);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  return;
}

Assistant:

void ForEachStatement()
    {
        SQObject idxname, valname;
        Lex(); Expect(_SC('(')); valname = Expect(TK_IDENTIFIER);
        if(_token == _SC(',')) {
            idxname = valname;
            Lex(); valname = Expect(TK_IDENTIFIER);
        }
        else{
            idxname = _fs->CreateString(_SC("@INDEX@"));
        }
        Expect(TK_IN);

        //save the stack size
        BEGIN_SCOPE();
        //put the table in the stack(evaluate the table expression)
        Expression(); Expect(_SC(')'));
        SQInteger container = _fs->TopTarget();
        //push the index local var
        SQInteger indexpos = _fs->PushLocalVariable(idxname);
        _fs->AddInstruction(_OP_LOADNULLS, indexpos,1);
        //push the value local var
        SQInteger valuepos = _fs->PushLocalVariable(valname);
        _fs->AddInstruction(_OP_LOADNULLS, valuepos,1);
        //push reference index
        SQInteger itrpos = _fs->PushLocalVariable(_fs->CreateString(_SC("@ITERATOR@"))); //use invalid id to make it inaccessible
        _fs->AddInstruction(_OP_LOADNULLS, itrpos,1);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_FOREACH, container, 0, indexpos);
        SQInteger foreachpos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_POSTFOREACH, container, 0, indexpos);
        //generate the statement code
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(foreachpos, 1, _fs->GetCurrentPos() - foreachpos);
        _fs->SetInstructionParam(foreachpos + 1, 1, _fs->GetCurrentPos() - foreachpos);
        END_BREAKBLE_BLOCK(foreachpos - 1);
        //restore the local variable stack(remove index,val and ref idx)
        _fs->PopTarget();
        END_SCOPE();
    }